

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void checkSizes(lua_State *L)

{
  global_State *pgVar1;
  uint newsize;
  char *pcVar2;
  int hs;
  global_State *g;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  if (pgVar1->gckind != '\x01') {
    newsize = (pgVar1->strt).size / 2;
    if ((pgVar1->strt).nuse < newsize) {
      luaS_resize(L,newsize);
    }
    pcVar2 = (char *)luaM_realloc_(L,(pgVar1->buff).buffer,(pgVar1->buff).buffsize,0);
    (pgVar1->buff).buffer = pcVar2;
    (pgVar1->buff).buffsize = 0;
  }
  return;
}

Assistant:

static void checkSizes (lua_State *L) {
  global_State *g = G(L);
  if (g->gckind != KGC_EMERGENCY) {  /* do not change sizes in emergency */
    int hs = g->strt.size / 2;  /* half the size of the string table */
    if (g->strt.nuse < cast(lu_int32, hs))  /* using less than that half? */
      luaS_resize(L, hs);  /* halve its size */
    luaZ_freebuffer(L, &g->buff);  /* free concatenation buffer */
  }
}